

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O1

void __thiscall t_d_generator::emit_doc(t_d_generator *this,t_doc *doc,ostream *out)

{
  int *piVar1;
  ostream *poVar2;
  
  if (doc->has_doc_ == true) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/**",3);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(doc->doc_)._M_dataplus._M_p,(doc->doc_)._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"*/",2);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void emit_doc(t_doc *doc, std::ostream& out) {
    if (!doc->has_doc()) {
      return;
    }
    indent(out) << "/**" << std::endl;
    indent_up();
    // No endl -- comments reliably have a newline at the end.
    // This is true even for stuff like:
    //     /** method infos */ void foo(/** huh?*/ 1: i64 stuff)
    indent(out) << doc->get_doc();
    indent_down();
    indent(out) << "*/" << std::endl;
  }